

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDEdge::RemoveFaceFromArray(ON_SubDEdge *this,ON_SubDFace *f)

{
  uint uVar1;
  uint local_24;
  uint i;
  ON_SubDFace *f_local;
  ON_SubDEdge *this_local;
  
  if (f != (ON_SubDFace *)0x0) {
    if (this->m_face_count < 3) {
      for (local_24 = 0; local_24 < this->m_face_count; local_24 = local_24 + 1) {
        uVar1 = local_24;
        if (f == (ON_SubDFace *)(this->m_face2[local_24].m_ptr & 0xfffffffffffffff8)) {
          while (local_24 = uVar1 + 1, local_24 < this->m_face_count) {
            this->m_face2[uVar1].m_ptr = this->m_face2[local_24].m_ptr;
            uVar1 = local_24;
          }
          this->m_face_count = this->m_face_count - 1;
          return true;
        }
      }
    }
    else {
      for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
        uVar1 = local_24;
        if (f == (ON_SubDFace *)(this->m_face2[local_24].m_ptr & 0xfffffffffffffff8)) {
          while (local_24 = uVar1 + 1, local_24 < 2) {
            this->m_face2[uVar1].m_ptr = this->m_face2[local_24].m_ptr;
            uVar1 = local_24;
          }
          this->m_face2[1].m_ptr = this->m_facex->m_ptr;
          for (local_24 = 3; local_24 < this->m_face_count; local_24 = local_24 + 1) {
            this->m_facex[local_24 - 3].m_ptr = this->m_facex[local_24 - 2].m_ptr;
          }
          this->m_face_count = this->m_face_count - 1;
          return true;
        }
      }
      for (local_24 = 2; local_24 < this->m_face_count; local_24 = local_24 + 1) {
        uVar1 = local_24;
        if (f == (ON_SubDFace *)(this->m_facex[local_24 - 2].m_ptr & 0xfffffffffffffff8)) {
          while (local_24 = uVar1 + 1, local_24 < this->m_face_count) {
            this->m_facex[uVar1 - 2].m_ptr = this->m_facex[uVar1 - 1].m_ptr;
            uVar1 = local_24;
          }
          this->m_face_count = this->m_face_count - 1;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdge::RemoveFaceFromArray(
  const ON_SubDFace* f
  )
{
  unsigned int i;
  if (nullptr == f)
    return false;

  if (m_face_count <= 2)
  {
    for (i = 0; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_face2[i - 1] = m_face2[i];
        m_face_count--;
        return true;
      }
    }
  }
  else
  {
    for (i = 0; i < 2; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_face2[i].m_ptr))
      {
        for (i++; i < 2; i++)
          m_face2[i - 1] = m_face2[i];
        m_face2[1] = m_facex[0];
        for (i = 3; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
    for (i = 2; i < m_face_count; i++)
    {
      if (f == ON_SUBD_FACE_POINTER(m_facex[i - 2].m_ptr))
      {
        for (i++; i < m_face_count; i++)
          m_facex[i - 3] = m_facex[i - 2];
        m_face_count--;
        return true;
      }
    }
  }

  return false;
}